

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtcnn.cpp
# Opt level: O2

void __thiscall Rnet::run(Rnet *this,Mat *image)

{
  image2Matrix(image,this->rgb,0);
  convolution(this->conv1_wb,this->rgb,this->conv1_out);
  prelu(this->conv1_out,this->conv1_wb->pbias,this->prelu_gmma1->pdata);
  maxPooling(this->conv1_out,this->pooling1_out,3,2);
  convolution(this->conv2_wb,this->pooling1_out,this->conv2_out);
  prelu(this->conv2_out,this->conv2_wb->pbias,this->prelu_gmma2->pdata);
  maxPooling(this->conv2_out,this->pooling2_out,3,2);
  convolution(this->conv3_wb,this->pooling2_out,this->conv3_out);
  prelu(this->conv3_out,this->conv3_wb->pbias,this->prelu_gmma3->pdata);
  fullconnect(this->fc4_wb,this->conv3_out,this->fc4_out);
  prelu(this->fc4_out,this->fc4_wb->pbias,this->prelu_gmma4->pdata);
  fullconnect(this->score_wb,this->fc4_out,this->score_);
  addbias(this->score_,this->score_wb->pbias);
  softmax(this->score_);
  fullconnect(this->location_wb,this->fc4_out,this->location_);
  addbias(this->location_,this->location_wb->pbias);
  return;
}

Assistant:

void Rnet::run(Mat &image) {
    image2Matrix(image, this->rgb);

    convolution(this->conv1_wb, this->rgb, this->conv1_out);
    prelu(this->conv1_out, this->conv1_wb->pbias, this->prelu_gmma1->pdata);

    maxPooling(this->conv1_out, this->pooling1_out, 3, 2);

    convolution(this->conv2_wb, this->pooling1_out, this->conv2_out);
    prelu(this->conv2_out, this->conv2_wb->pbias, this->prelu_gmma2->pdata);
    maxPooling(this->conv2_out, this->pooling2_out, 3, 2);

    //conv3
    convolution(this->conv3_wb, this->pooling2_out, this->conv3_out);
    prelu(this->conv3_out, this->conv3_wb->pbias, this->prelu_gmma3->pdata);

    //flatten
    fullconnect(this->fc4_wb, this->conv3_out, this->fc4_out);
    prelu(this->fc4_out, this->fc4_wb->pbias, this->prelu_gmma4->pdata);

    //conv51   score
    fullconnect(this->score_wb, this->fc4_out, this->score_);
    addbias(this->score_, this->score_wb->pbias);
    softmax(this->score_);

    //conv5_2   location
    fullconnect(this->location_wb, this->fc4_out, this->location_);
    addbias(this->location_, this->location_wb->pbias);
    // pBoxShow(location_);
}